

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O2

uint Ivy_TruthDsdCompute_rec(int iNode,Vec_Int_t *vTree)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Ivy_Dec_t Node;
  
  uVar1 = Vec_IntEntry(vTree,iNode);
  uVar5 = uVar1 & 0xf;
  switch(uVar5) {
  case 0:
    uVar4 = s_Masks[iNode][(uVar1 & 0x10) == 0];
    break;
  case 1:
    uVar4 = s_Masks[5][(uVar1 & 0x10) == 0];
    break;
  case 2:
    uVar4 = Ivy_TruthDsdCompute_rec(uVar1 >> 9 & 7,vTree);
    uVar4 = (int)(uVar1 << 0x1b) >> 0x1f ^ uVar4;
    break;
  case 3:
    uVar4 = 0xffffffff;
    for (uVar5 = 0; (uVar1 >> 5 & 7) != uVar5; uVar5 = uVar5 + 1) {
      uVar2 = Ivy_DecGetVar(&Node,uVar5);
      uVar3 = Ivy_TruthDsdCompute_rec(uVar2 >> 1,vTree);
      uVar4 = uVar4 & (-(uVar2 & 1) ^ uVar3);
    }
    goto LAB_0064f88c;
  case 4:
    uVar4 = 0;
    for (uVar5 = 0; (uVar1 >> 5 & 7) != uVar5; uVar5 = uVar5 + 1) {
      uVar2 = Ivy_DecGetVar(&Node,uVar5);
      uVar3 = Ivy_TruthDsdCompute_rec(uVar2 >> 1,vTree);
      if ((uVar2 & 1) != 0) {
        __assert_fail("(Var & 1) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                      ,0x1b6,"unsigned int Ivy_TruthDsdCompute_rec(int, Vec_Int_t *)");
      }
      uVar4 = uVar4 ^ uVar3;
    }
LAB_0064f88c:
    uVar4 = (int)(uVar1 << 0x1b) >> 0x1f ^ uVar4;
    break;
  default:
    if ((uVar1 & 0x10) != 0) {
      __assert_fail("Node.fCompl == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                    ,0x1ba,"unsigned int Ivy_TruthDsdCompute_rec(int, Vec_Int_t *)");
    }
    if (1 < uVar5 - 5) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                    ,0x1ce,"unsigned int Ivy_TruthDsdCompute_rec(int, Vec_Int_t *)");
    }
    uVar2 = Ivy_TruthDsdCompute_rec(uVar1 >> 9 & 7,vTree);
    uVar3 = Ivy_TruthDsdCompute_rec(uVar1 >> 0xd & 7,vTree);
    uVar4 = Ivy_TruthDsdCompute_rec(uVar1 >> 0x11 & 7,vTree);
    uVar6 = uVar1 >> 8 & 1;
    if (uVar6 != 0 && uVar5 != 6) {
      __assert_fail("Node.Type == IVY_DEC_MAJ || (VarC & 1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                    ,0x1c5,"unsigned int Ivy_TruthDsdCompute_rec(int, Vec_Int_t *)");
    }
    uVar2 = uVar2 ^ -uVar6;
    uVar3 = uVar3 ^ (int)(uVar1 << 0x13) >> 0x1f;
    uVar4 = uVar4 ^ (int)(uVar1 << 0xf) >> 0x1f;
    if (uVar5 == 5) {
      uVar4 = (uVar3 ^ uVar4) & uVar2 ^ uVar4;
    }
    else {
      uVar4 = uVar4 & uVar3 | (uVar4 | uVar3) & uVar2;
    }
  }
  return uVar4;
}

Assistant:

unsigned Ivy_TruthDsdCompute_rec( int iNode, Vec_Int_t * vTree )
{
    unsigned uTruthChild, uTruthTotal;
    int Var, i;
    // get the node
    Ivy_Dec_t Node = Ivy_IntToDec( Vec_IntEntry(vTree, iNode) );
    // compute the node function
    if ( Node.Type == IVY_DEC_CONST1 )
        return s_Masks[5][ !Node.fCompl ];
    if ( Node.Type == IVY_DEC_PI )
        return s_Masks[iNode][ !Node.fCompl ];
    if ( Node.Type == IVY_DEC_BUF )
    {
        uTruthTotal = Ivy_TruthDsdCompute_rec( Node.Fan0 >> 1, vTree );
        return Node.fCompl? ~uTruthTotal : uTruthTotal;
    }
    if ( Node.Type == IVY_DEC_AND )
    {
        uTruthTotal = s_Masks[5][1];
        for ( i = 0; i < (int)Node.nFans; i++ )
        {
            Var = Ivy_DecGetVar( &Node, i );
            uTruthChild = Ivy_TruthDsdCompute_rec( Var >> 1, vTree );
            uTruthTotal = (Var & 1)? uTruthTotal & ~uTruthChild : uTruthTotal & uTruthChild;
        }
        return Node.fCompl? ~uTruthTotal : uTruthTotal;
    }
    if ( Node.Type == IVY_DEC_EXOR )
    {
        uTruthTotal = 0;
        for ( i = 0; i < (int)Node.nFans; i++ )
        {
            Var = Ivy_DecGetVar( &Node, i );
            uTruthTotal ^= Ivy_TruthDsdCompute_rec( Var >> 1, vTree );
            assert( (Var & 1) == 0 );
        }
        return Node.fCompl? ~uTruthTotal : uTruthTotal;
    }
    assert( Node.fCompl == 0 );
    if ( Node.Type == IVY_DEC_MUX || Node.Type == IVY_DEC_MAJ )
    {
        unsigned uTruthChildC, uTruthChild1, uTruthChild0;
        int VarC, Var1, Var0;
        VarC = Ivy_DecGetVar( &Node, 0 );
        Var1 = Ivy_DecGetVar( &Node, 1 );
        Var0 = Ivy_DecGetVar( &Node, 2 );
        uTruthChildC = Ivy_TruthDsdCompute_rec( VarC >> 1, vTree );
        uTruthChild1 = Ivy_TruthDsdCompute_rec( Var1 >> 1, vTree );
        uTruthChild0 = Ivy_TruthDsdCompute_rec( Var0 >> 1, vTree );
        assert( Node.Type == IVY_DEC_MAJ || (VarC & 1) == 0 );
        uTruthChildC = (VarC & 1)? ~uTruthChildC : uTruthChildC;
        uTruthChild1 = (Var1 & 1)? ~uTruthChild1 : uTruthChild1;
        uTruthChild0 = (Var0 & 1)? ~uTruthChild0 : uTruthChild0;
        if ( Node.Type == IVY_DEC_MUX )
            return (uTruthChildC & uTruthChild1) | (~uTruthChildC & uTruthChild0);
        else
            return (uTruthChildC & uTruthChild1) | (uTruthChildC & uTruthChild0) | (uTruthChild1 & uTruthChild0);
    }
    assert( 0 );
    return 0;
}